

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O3

void __thiscall
ctemplate::TemplateDictionary::SetFormattedValue
          (TemplateDictionary *this,TemplateString variable,char *format,...)

{
  UnsafeArena *pUVar1;
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *m;
  TemplateString key;
  TemplateString value;
  TemplateString value_00;
  char in_AL;
  int iVar2;
  char *space;
  VariableDict *pVVar3;
  void *__dest;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t __n;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *buffer;
  va_list ap;
  char *local_160;
  void *local_158;
  size_t sStack_150;
  undefined1 local_148;
  uint7 uStack_147;
  undefined8 uStack_140;
  char *local_138;
  long lStack_130;
  undefined1 local_128;
  uint7 uStack_127;
  undefined8 uStack_120;
  char *local_118;
  size_t sStack_110;
  bool local_108;
  undefined7 uStack_107;
  TemplateId TStack_100;
  __va_list_tag local_f8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined4 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Da;
    local_98 = in_XMM1_Da;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  space = (char *)BaseArena::GetMemory(&this->arena_->super_BaseArena,0x400,1);
  local_f8.overflow_arg_area = &stack0x00000028;
  local_f8.gp_offset = 0x10;
  local_f8.fp_offset = 0x30;
  local_f8.reg_save_area = local_d8;
  iVar2 = StringAppendV(space,&local_160,format,&local_f8);
  if (this->variable_dict_ == (VariableDict *)0x0) {
    pVVar3 = (VariableDict *)BaseArena::GetMemory(&this->arena_->super_BaseArena,0xb0,8);
    pUVar1 = this->arena_;
    pVVar3->size_ = 0;
    (pVVar3->functor_).arena_ = pUVar1;
    this->variable_dict_ = pVVar3;
  }
  if (local_160 == space) {
    BaseArena::AdjustLastAlloc(&this->arena_->super_BaseArena,space,(long)(iVar2 + 1));
    lStack_130 = (long)iVar2;
    local_128 = 0;
    uStack_120 = 0;
    value_00.length_ = lStack_130;
    value_00.ptr_ = space;
    value_00._16_8_ = (ulong)uStack_127 << 8;
    value_00.id_ = 0;
    local_138 = space;
    HashInsert<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,ctemplate::TemplateString>
              (this->variable_dict_,variable,value_00);
  }
  else {
    BaseArena::AdjustLastAlloc(&this->arena_->super_BaseArena,space,0);
    m = this->variable_dict_;
    local_118 = variable.ptr_;
    sStack_110 = variable.length_;
    local_108 = variable.is_immutable_;
    uStack_107 = variable._17_7_;
    TStack_100 = variable.id_;
    __n = (size_t)iVar2;
    __dest = BaseArena::GetMemory(&this->arena_->super_BaseArena,__n + 1,1);
    memcpy(__dest,local_160,__n);
    *(undefined1 *)((long)__dest + __n) = 0;
    local_148 = 0;
    uStack_140 = 0;
    key.length_ = sStack_110;
    key.ptr_ = local_118;
    key.is_immutable_ = local_108;
    key._17_7_ = uStack_107;
    key.id_ = TStack_100;
    value.length_ = __n;
    value.ptr_ = (char *)__dest;
    value._16_8_ = (ulong)uStack_147 << 8;
    value.id_ = 0;
    local_158 = __dest;
    sStack_150 = __n;
    HashInsert<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,ctemplate::TemplateString>
              (m,key,value);
    if (local_160 != (char *)0x0) {
      operator_delete__(local_160);
    }
  }
  return;
}

Assistant:

void TemplateDictionary::SetFormattedValue(const TemplateString variable,
                                           const char* format, ...) {
  char* buffer;

  char* scratch = arena_->Alloc(1024);  // StringAppendV requires >=1024 bytes
  va_list ap;
  va_start(ap, format);
  const int buflen = StringAppendV(scratch, &buffer, format, ap);
  va_end(ap);

  LazilyCreateDict(&variable_dict_);

  // If it fit into scratch, great, otherwise we need to copy into arena
  if (buffer == scratch) {
    scratch = arena_->Shrink(scratch, buflen+1);   // from 1024 to |value+\0|
    HashInsert(variable_dict_, variable, TemplateString(scratch, buflen));
  } else {
    arena_->Shrink(scratch, 0);   // reclaim arena space we didn't use
    HashInsert(variable_dict_, variable, Memdup(buffer, buflen));
    delete[] buffer;
  }
}